

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setupTest.cpp
# Opt level: O3

void __thiscall Setup_Boundary_Test::TestBody(Setup_Boundary_Test *this)

{
  lattice *grid;
  double **P;
  double **V;
  double **U;
  double init [3];
  AssertionResult gtest_ar_;
  double **local_70;
  double **local_68;
  double **local_60;
  double local_58 [3];
  undefined1 local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_60 = (double **)0x0;
  local_68 = (double **)0x0;
  local_70 = (double **)0x0;
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  local_58[2] = 1.0;
  grid = &(this->super_Setup).grid;
  initFlags("Step",(this->super_Setup).bCond.FLAG,grid,(this->super_Setup).Region);
  local_40 = 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  initUVP(&local_60,&local_68,&local_70,(this->super_Setup).grid.imax,(this->super_Setup).grid.jmax,
          local_58);
  setBCond(local_60,local_68,grid,&(this->super_Setup).bCond);
  setSpecBCond(local_60,local_68,grid,"Step");
  applyPbndCond(local_70,grid,(this->super_Setup).bCond.FLAG);
  destroy2Dfield(local_60,(this->super_Setup).grid.deli + 3);
  destroy2Dfield(local_68,(this->super_Setup).grid.deli + 2);
  destroy2Dfield(local_70,(this->super_Setup).grid.deli + 2);
  return;
}

Assistant:

TEST_F(Setup, Boundary)
{
	REAL **U = nullptr, **V = nullptr, **P = nullptr;
	REAL init[3] = {1.0,1.0,1.0};
	initFlags("Step",bCond.FLAG,&grid,Region);
	int ib = grid.imax/2-grid.il, jb = grid.jmax/2-grid.jb;
	if (ib > grid.deli)
		ib = grid.deli;
	if (jb > grid.delj)
		jb = grid.delj;
	ASSERT_TRUE(cmpFlags(bCond.FLAG,ib,jb));
	initUVP(&U,&V,&P,grid.imax,grid.jmax,init);

	setBCond(U,V,&grid,&bCond);
	setSpecBCond(U,V,&grid,"Step");
	applyPbndCond(P,&grid,bCond.FLAG);
/*
	print2Dfield(U,grid.deli+3,grid.delj+2);
	print2Dfield(V,grid.deli+2,grid.delj+3);
	print2Dfield(P,grid.deli+2,grid.delj+2);
*/
	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
}